

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprImpliesExpr(Parse *pParse,Expr *pE1,Expr *pE2,int iTab)

{
  u8 uVar1;
  int iVar2;
  
  iVar2 = sqlite3ExprCompare(pParse,pE1,pE2,iTab);
  if (iVar2 == 0) {
    return 1;
  }
  uVar1 = pE2->op;
  if (uVar1 == '+') {
    iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pLeft,iTab);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pRight,iTab);
    if (iVar2 != 0) {
      return 1;
    }
    uVar1 = pE2->op;
  }
  if ((uVar1 == '3') && (iVar2 = exprImpliesNotNull(pParse,pE1,pE2->pLeft,iTab,0), iVar2 != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesExpr(
  const Parse *pParse,
  const Expr *pE1,
  const Expr *pE2,
  int iTab
){
  if( sqlite3ExprCompare(pParse, pE1, pE2, iTab)==0 ){
    return 1;
  }
  if( pE2->op==TK_OR
   && (sqlite3ExprImpliesExpr(pParse, pE1, pE2->pLeft, iTab)
             || sqlite3ExprImpliesExpr(pParse, pE1, pE2->pRight, iTab) )
  ){
    return 1;
  }
  if( pE2->op==TK_NOTNULL
   && exprImpliesNotNull(pParse, pE1, pE2->pLeft, iTab, 0)
  ){
    return 1;
  }
  return 0;
}